

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

int asm_swapops(ASMState *as,IRIns *ir)

{
  ushort uVar1;
  uint uVar2;
  IRIns *pIVar3;
  int iVar4;
  ulong uVar5;
  
  iVar4 = 0;
  if ((lj_ir_mode[(ir->field_1).o] & 0x10) != 0) {
    uVar1 = (ir->field_0).op2;
    if ((short)uVar1 < 0) {
      pIVar3 = as->ir;
      uVar5 = (ulong)(ir->field_0).op1;
      if ((-1 < *(char *)((long)pIVar3 + uVar5 * 8 + 6)) ||
         (((*(byte *)((long)pIVar3 + (ulong)uVar1 * 8 + 6) ^ (ir->field_1).r) & 0x7f) == 0)) {
        return 1;
      }
      uVar2 = as->loopref;
      if ((as->curins <= uVar2) ||
         (((uVar2 <= uVar1 || ((*(byte *)((long)pIVar3 + (ulong)uVar1 * 8 + 4) & 0x40) != 0)) &&
          ((uVar2 <= (ir->field_0).op1 ||
           (iVar4 = 1, (*(byte *)((long)pIVar3 + uVar5 * 8 + 4) & 0x40) != 0)))))) {
        return (int)((byte)(*(char *)((long)pIVar3 + uVar5 * 8 + 5) + 0xbeU) < 7);
      }
    }
  }
  return iVar4;
}

Assistant:

static int asm_swapops(ASMState *as, IRIns *ir)
{
  IRIns *irl = IR(ir->op1);
  IRIns *irr = IR(ir->op2);
  lj_assertA(ra_noreg(irr->r), "bad usage");
  if (!irm_iscomm(lj_ir_mode[ir->o]))
    return 0;  /* Can't swap non-commutative operations. */
  if (irref_isk(ir->op2))
    return 0;  /* Don't swap constants to the left. */
  if (ra_hasreg(irl->r))
    return 1;  /* Swap if left already has a register. */
  if (ra_samehint(ir->r, irr->r))
    return 1;  /* Swap if dest and right have matching hints. */
  if (as->curins > as->loopref) {  /* In variant part? */
    if (ir->op2 < as->loopref && !irt_isphi(irr->t))
      return 0;  /* Keep invariants on the right. */
    if (ir->op1 < as->loopref && !irt_isphi(irl->t))
      return 1;  /* Swap invariants to the right. */
  }
  if (opisfusableload(irl->o))
    return 1;  /* Swap fusable loads to the right. */
  return 0;  /* Otherwise don't swap. */
}